

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  TestEventRepeater *pTVar2;
  pointer ppTVar3;
  pointer piVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  size_t sVar9;
  long *plVar10;
  pointer ppTVar11;
  TestPartResult *pTVar12;
  long lVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar14;
  long *plVar15;
  size_type *psVar16;
  pointer pbVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  byte bVar21;
  __normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>
  __tmp;
  TestResult *this_00;
  pointer ppEVar22;
  pointer pbVar23;
  int iVar24;
  char *pcVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  pointer ppEVar29;
  TestSuite *pTVar30;
  pointer pbVar31;
  byte bVar32;
  char kNoTestLinkedFatal [69];
  char kNoTestLinkedWarning [35];
  char kNoTestLinkedMessage [50];
  long *local_188;
  long local_180;
  long local_178;
  long lStack_170;
  long *local_168;
  ulong local_160;
  long local_158 [2];
  undefined1 local_148 [64];
  undefined4 local_108;
  undefined1 local_104;
  undefined1 local_f8 [24];
  undefined7 uStack_e0;
  undefined4 uStack_d9;
  pointer local_c8;
  pointer local_c0;
  ulong local_b8;
  long local_b0;
  long *local_a8;
  ulong local_a0;
  long local_98;
  long lStack_90;
  string local_88;
  long *local_68;
  long lStack_60;
  long local_58;
  long lStack_50;
  char local_48 [24];
  
  bVar32 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_148,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&g_argvs_abi_cxx11_);
  pbVar23 = (pointer)local_148._8_8_;
  pbVar31 = (pointer)local_148._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_148);
  if (g_help_flag != '\0') {
    return true;
  }
  PostFlagParsingInit(this);
  cVar5 = FLAGS_gtest_fail_if_no_test_linked;
  ppTVar11 = (this->test_suites_).
             super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  lVar13 = (long)(this->test_suites_).
                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11;
  if (lVar13 == 0) {
LAB_00411204:
    builtin_strncpy(local_48,"in any test case.",0x12);
    local_58._0_1_ = 'm';
    local_58._1_1_ = ' ';
    local_58._2_1_ = 'd';
    local_58._3_1_ = 'o';
    local_58._4_1_ = 'e';
    local_58._5_1_ = 's';
    local_58._6_1_ = ' ';
    local_58._7_1_ = 'N';
    lStack_50._0_1_ = 'O';
    lStack_50._1_1_ = 'T';
    lStack_50._2_1_ = ' ';
    lStack_50._3_1_ = 'l';
    lStack_50._4_1_ = 'i';
    lStack_50._5_1_ = 'n';
    lStack_50._6_1_ = 'k';
    lStack_50._7_1_ = ' ';
    local_68 = (long *)0x7365742073696854;
    lStack_60._0_1_ = 't';
    lStack_60._1_1_ = ' ';
    lStack_60._2_1_ = 'p';
    lStack_60._3_1_ = 'r';
    lStack_60._4_1_ = 'o';
    lStack_60._5_1_ = 'g';
    lStack_60._6_1_ = 'r';
    lStack_60._7_1_ = 'a';
    pcVar25 = "This is INVALID. Please make sure to link in at least one test case.";
    pvVar14 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_148;
    for (lVar13 = 8; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pvVar14->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = *(pointer *)pcVar25;
      pcVar25 = pcVar25 + ((ulong)bVar32 * -2 + 1) * 8;
      pvVar14 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)pvVar14 + ((ulong)bVar32 * -2 + 1) * 8);
    }
    local_104 = 0;
    local_108 = 0x2e657361;
    local_f8[0x10] = ' ';
    local_f8[0x11] = 't';
    local_f8[0x12] = 'h';
    local_f8[0x13] = 'i';
    local_f8[0x14] = 's';
    local_f8[0x15] = ' ';
    local_f8[0x16] = 'i';
    local_f8[0x17] = 's';
    uStack_e0 = 0x646e65746e6920;
    local_f8._0_8_ = (pointer)0x6d20657361656c50;
    local_f8[8] = 'a';
    local_f8[9] = 'k';
    local_f8[10] = 'e';
    local_f8[0xb] = ' ';
    local_f8[0xc] = 's';
    local_f8[0xd] = 'u';
    local_f8[0xe] = 'r';
    local_f8[0xf] = 'e';
    uStack_d9 = 0x2e6465;
    pvVar14 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f8;
    if (FLAGS_gtest_fail_if_no_test_linked != '\0') {
      pvVar14 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148;
    }
    ColoredPrintf(kRed,"%s %s\n",&local_68,pvVar14);
    if (cVar5 != '\0') {
      return false;
    }
    local_168 = local_158;
    sVar9 = strlen((char *)&local_68);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,&local_68,(long)&local_68 + sVar9);
    plVar10 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_168,local_160,0,'\x01');
    local_188 = &local_178;
    plVar15 = plVar10 + 2;
    if ((long *)*plVar10 == plVar15) {
      local_178 = *plVar15;
      lStack_170 = plVar10[3];
    }
    else {
      local_178 = *plVar15;
      local_188 = (long *)*plVar10;
    }
    local_180 = plVar10[1];
    *plVar10 = (long)plVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_188);
    plVar15 = plVar10 + 2;
    if ((long *)*plVar10 == plVar15) {
      local_98 = *plVar15;
      lStack_90 = plVar10[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar15;
      local_a8 = (long *)*plVar10;
    }
    local_a0 = plVar10[1];
    *plVar10 = (long)plVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_a8,local_a0,0,'\x01');
    psVar16 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_88.field_2._M_allocated_capacity = *psVar16;
      local_88.field_2._8_8_ = plVar10[3];
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar16;
      local_88._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_88._M_string_length = plVar10[1];
    *plVar10 = (long)psVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    AppendToTestWarningsOutputFile(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if (local_168 != local_158) {
      operator_delete(local_168,local_158[0] + 1);
    }
  }
  else {
    lVar13 = lVar13 >> 3;
    lVar19 = 0;
    iVar24 = 0;
    do {
      pTVar30 = ppTVar11[lVar19];
      iVar24 = iVar24 + (int)((ulong)((long)(pTVar30->test_info_list_).
                                            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     *(long *)&(pTVar30->test_info_list_).
                                               super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                               ._M_impl.super__Vector_impl_data) >> 3);
      lVar19 = lVar19 + 1;
    } while (lVar13 + (ulong)(lVar13 == 0) != lVar19);
    if (iVar24 == 0) goto LAB_00411204;
  }
  WriteToShardStatusFileIfNeeded();
  pIVar1 = (this->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  bVar6 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                      pIVar1 != (InternalRunDeathTestFlag *)0x0);
  iVar24 = FilterTests(this,(uint)!bVar6);
  if (FLAGS_gtest_list_tests == '\x01') {
    ListTestsMatchingFilter(this);
    return true;
  }
  iVar18 = FLAGS_gtest_random_seed;
  if (FLAGS_gtest_random_seed == 0) {
    lVar13 = std::chrono::_V2::system_clock::now();
    iVar18 = (int)(SUB168(SEXT816(lVar13) * SEXT816(0x431bde82d7b634db),8) >> 0x12) -
             (SUB164(SEXT816(lVar13) * SEXT816(0x431bde82d7b634db),0xc) >> 0x1f);
  }
  this->random_seed_ = (iVar18 - 1U) % 99999 + 1;
  pTVar2 = (this->listeners_).repeater_;
  lVar13 = std::chrono::_V2::system_clock::now();
  this->start_timestamp_ = lVar13 / 1000000;
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[2])(pTVar2,this->parent_);
  bVar32 = FLAGS_gtest_recreate_environments_when_repeating;
  uVar20 = 1;
  if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
    uVar20 = (ulong)FLAGS_gtest_repeat;
  }
  iVar18 = (int)uVar20;
  if (iVar18 != 0) {
    local_c8 = pbVar23;
    local_c0 = pbVar31;
    uVar27 = 0;
    bVar21 = 0;
    local_b8 = uVar20;
LAB_0041159a:
    ppTVar3 = (this->test_suites_).
              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar11 = (this->test_suites_).
                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppTVar11 != ppTVar3;
        ppTVar11 = ppTVar11 + 1) {
      TestSuite::ClearResult(*ppTVar11);
    }
    local_b0 = std::chrono::_V2::steady_clock::now();
    iVar26 = (int)uVar27;
    if (0 < iVar24) {
      if (FLAGS_gtest_shuffle == '\x01') {
        (this->random_).state_ = this->random_seed_;
        ShuffleTests(this);
      }
      (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])(pTVar2,this->parent_,uVar27);
      if (iVar26 == 0 || (iVar18 < 0 || (bVar32 & 1) != 0)) {
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[4])(pTVar2,this->parent_);
        ppEVar22 = (this->environments_).
                   super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        for (ppEVar29 = (this->environments_).
                        super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppEVar29 != ppEVar22;
            ppEVar29 = ppEVar29 + 1) {
          (**(code **)(*(long *)*ppEVar29 + 0x10))();
        }
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[5])(pTVar2,this->parent_);
      }
      bVar6 = Test::IsSkipped();
      if (bVar6) {
        UnitTest::GetInstance();
        if ((UnitTest::GetInstance::instance.impl_)->current_test_info_ == (TestInfo *)0x0) {
          if ((UnitTest::GetInstance::instance.impl_)->current_test_suite_ == (TestSuite *)0x0) {
            this_00 = &(UnitTest::GetInstance::instance.impl_)->ad_hoc_test_result_;
          }
          else {
            this_00 = &(UnitTest::GetInstance::instance.impl_)->current_test_suite_->
                       ad_hoc_test_result_;
          }
        }
        else {
          this_00 = &(UnitTest::GetInstance::instance.impl_)->current_test_info_->result_;
        }
        if (0 < (int)((ulong)((long)(this_00->test_part_results_).
                                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_00->test_part_results_).
                                   super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
          iVar28 = 0;
          do {
            pTVar12 = TestResult::GetTestPartResult(this_00,iVar28);
            if (pTVar12->type_ == kSkip) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_148,(pTVar12->message_)._M_dataplus._M_p,
                         (allocator<char> *)&local_68);
              puts((char *)local_148._0_8_);
              if ((pointer)local_148._0_8_ != (pointer)(local_148 + 0x10)) {
                operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
              }
            }
            iVar28 = iVar28 + 1;
            iVar8 = (int)((ulong)((long)(this_00->test_part_results_).
                                        super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this_00->test_part_results_).
                                       super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
          } while (SBORROW4(iVar28,iVar8 * -0x49249249) != iVar28 + iVar8 * 0x49249249 < 0);
        }
        fflush(_stdout);
      }
      else {
        bVar6 = Test::HasFatalFailure();
        if (bVar6) {
          bVar6 = Test::HasFatalFailure();
          if ((bVar6) &&
             (ppTVar11 = (this->test_suites_).
                         super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
             0 < (int)((ulong)((long)(this->test_suites_).
                                     super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11) >>
                      3))) {
            lVar13 = 0;
            do {
              TestSuite::Skip(ppTVar11[(uint)(this->test_suite_indices_).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[lVar13]]);
              lVar13 = lVar13 + 1;
              ppTVar11 = (this->test_suites_).
                         super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            } while (lVar13 < (int)((ulong)((long)(this->test_suites_).
                                                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)ppTVar11) >> 3));
          }
        }
        else {
          ppTVar11 = (this->test_suites_).
                     super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (0 < (int)((ulong)((long)(this->test_suites_).
                                      super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11)
                       >> 3)) {
            lVar13 = 1;
            do {
              TestSuite::Run(ppTVar11[(uint)(this->test_suite_indices_).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[lVar13 + -1]]);
              if (FLAGS_gtest_fail_fast == '\x01') {
                piVar4 = (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                if ((lVar13 + -1 <
                     (long)(int)((ulong)((long)(this->test_suite_indices_).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish - (long)piVar4) >>
                                2)) && (lVar19 = (long)piVar4[lVar13 + -1], -1 < lVar19)) {
                  pTVar30 = (this->test_suites_).
                            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar19];
                }
                else {
                  pTVar30 = (TestSuite *)0x0;
                }
                iVar28 = TestSuite::failed_test_count(pTVar30);
                if ((0 < iVar28) ||
                   (bVar6 = TestResult::Failed(&pTVar30->ad_hoc_test_result_), bVar6))
                goto LAB_004117db;
              }
              ppTVar11 = (this->test_suites_).
                         super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              bVar6 = lVar13 < (int)((ulong)((long)(this->test_suites_).
                                                                                                      
                                                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)ppTVar11) >> 3);
              lVar13 = lVar13 + 1;
            } while (bVar6);
          }
        }
      }
      goto LAB_004118a5;
    }
    (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])(pTVar2,this->parent_,uVar27);
    goto LAB_004118f2;
  }
  bVar6 = true;
LAB_0041199e:
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0x11])(pTVar2,this->parent_);
  ppEVar29 = (this->environments_).
             super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppEVar22 = (this->environments_).
             super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar29 != ppEVar22) {
    do {
      if (*ppEVar29 != (Environment *)0x0) {
        (**(code **)(*(long *)*ppEVar29 + 8))();
      }
      ppEVar29 = ppEVar29 + 1;
    } while (ppEVar29 != ppEVar22);
    ppEVar29 = (this->environments_).
               super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((this->environments_).
        super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppEVar29) {
      (this->environments_).
      super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppEVar29;
    }
  }
  bVar7 = ShouldWarnIfNoTestsMatchFilter(this);
  if (bVar7) {
    local_f8._0_8_ = (pointer)(local_f8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"filter \"","");
    plVar10 = (long *)std::__cxx11::string::_M_append(local_f8,FLAGS_gtest_filter_abi_cxx11_);
    plVar15 = plVar10 + 2;
    if ((long *)*plVar10 == plVar15) {
      local_58 = *plVar15;
      lStack_50 = plVar10[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar15;
      local_68 = (long *)*plVar10;
    }
    lStack_60 = plVar10[1];
    *plVar10 = (long)plVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_68);
    pbVar17 = (pointer)(plVar10 + 2);
    if ((pointer)*plVar10 == pbVar17) {
      local_148._16_8_ = (pbVar17->_M_dataplus)._M_p;
      local_148._24_8_ = plVar10[3];
      local_148._0_8_ = (pointer)(local_148 + 0x10);
    }
    else {
      local_148._16_8_ = (pbVar17->_M_dataplus)._M_p;
      local_148._0_8_ = (pointer)*plVar10;
    }
    local_148._8_8_ = plVar10[1];
    *plVar10 = (long)pbVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_f8._16_8_)->_M_p + 1));
    }
    ColoredPrintf(kRed,"WARNING: %s",local_148._0_8_);
    AppendToTestWarningsOutputFile((string *)local_148);
    if ((pointer)local_148._0_8_ != (pointer)(local_148 + 0x10)) {
      operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
    }
  }
  if (pbVar31 == pbVar23) {
    ColoredPrintf(kRed,
                  "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                 );
  }
  return bVar6;
LAB_004117db:
  for (; ppTVar11 = (this->test_suites_).
                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
      (int)lVar13 <
      (int)((ulong)((long)(this->test_suites_).
                          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11) >> 3);
      lVar13 = lVar13 + 1) {
    TestSuite::Skip(ppTVar11[(uint)(this->test_suite_indices_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[lVar13]]);
  }
LAB_004118a5:
  if (iVar26 == iVar18 + -1 || (iVar18 < 0 || (bVar32 & 1) != 0)) {
    (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar2,this->parent_);
    ppEVar29 = (this->environments_).
               super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    for (ppEVar22 = (this->environments_).
                    super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish; ppEVar22 != ppEVar29;
        ppEVar22 = ppEVar22 + -1) {
      (**(code **)(*(long *)ppEVar22[-1] + 0x18))();
    }
    (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xf])(pTVar2,this->parent_);
  }
LAB_004118f2:
  lVar13 = std::chrono::_V2::steady_clock::now();
  this->elapsed_time_ = (lVar13 - local_b0) / 1000000;
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0x10])(pTVar2,this->parent_,uVar27);
  bVar6 = Passed(this);
  UnshuffleTests(this);
  if (FLAGS_gtest_shuffle == '\x01') {
    iVar28 = GetNextRandomSeed(this->random_seed_);
    this->random_seed_ = iVar28;
  }
  bVar21 = bVar21 | !bVar6;
  uVar27 = (ulong)(iVar26 + 1U);
  if (iVar26 + 1U == (uint)local_b8 && -1 < (int)(uint)local_b8) goto code_r0x00411987;
  goto LAB_0041159a;
code_r0x00411987:
  bVar6 = (bool)(bVar21 ^ 1);
  pbVar23 = local_c8;
  pbVar31 = local_c0;
  goto LAB_0041199e;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag) return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Handle the case where the program has no tests linked.
  // Sometimes this is a programmer mistake, but sometimes it is intended.
  if (total_test_count() == 0) {
    constexpr char kNoTestLinkedMessage[] =
        "This test program does NOT link in any test case.";
    constexpr char kNoTestLinkedFatal[] =
        "This is INVALID. Please make sure to link in at least one test case.";
    constexpr char kNoTestLinkedWarning[] =
        "Please make sure this is intended.";
    const bool fail_if_no_test_linked = GTEST_FLAG_GET(fail_if_no_test_linked);
    ColoredPrintf(
        GTestColor::kRed, "%s %s\n", kNoTestLinkedMessage,
        fail_if_no_test_linked ? kNoTestLinkedFatal : kNoTestLinkedWarning);
    if (fail_if_no_test_linked) {
      return false;
    }
#if GTEST_HAS_FILE_SYSTEM
    AppendToTestWarningsOutputFile(std::string(kNoTestLinkedMessage) + ' ' +
                                   kNoTestLinkedWarning + '\n');
#endif  // GTEST_HAS_FILE_SYSTEM
  }

#if GTEST_HAS_FILE_SYSTEM
  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();
#endif  // GTEST_HAS_FILE_SYSTEM

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#ifdef GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test = (internal_run_death_test_flag_ != nullptr);
#if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
#endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run =
      FilterTests(should_shard ? HONOR_SHARDING_PROTOCOL
                               : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG_GET(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GetRandomSeedFromFlag(GTEST_FLAG_GET(random_seed));

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG_GET(repeat);

  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;

  // Should test environments be set up and torn down for each repeat, or only
  // set up on the first and torn down on the last iteration? If there is no
  // "last" iteration because the tests will repeat forever, always recreate the
  // environments to avoid leaks in case one of the environments is using
  // resources that are external to this process. Without this check there would
  // be no way to clean up those external resources automatically.
  const bool recreate_environments_when_repeating =
      GTEST_FLAG_GET(recreate_environments_when_repeating) ||
      gtest_repeat_forever;

  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    Timer timer;

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG_GET(shuffle)) {
      random()->Reseed(static_cast<uint32_t>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand. If test environments aren't
      // recreated for each iteration, only do so on the first iteration.
      if (i == 0 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsSetUpStart(*parent_);
        ForEach(environments_, SetUpEnvironment);
        repeater->OnEnvironmentsSetUpEnd(*parent_);
      }

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
          if (GTEST_FLAG_GET(fail_fast) &&
              GetMutableSuiteCase(test_index)->Failed()) {
            for (int j = test_index + 1; j < total_test_suite_count(); j++) {
              GetMutableSuiteCase(j)->Skip();
            }
            break;
          }
        }
      } else if (Test::HasFatalFailure()) {
        // If there was a fatal failure during the global setup then we know we
        // aren't going to run any tests. Explicitly mark all of the tests as
        // skipped to make this obvious in the output.
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Skip();
        }
      }

      // Tears down all environments in reverse order afterwards. If test
      // environments aren't recreated for each iteration, only do so on the
      // last iteration.
      if (i == repeat - 1 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsTearDownStart(*parent_);
        std::for_each(environments_.rbegin(), environments_.rend(),
                      TearDownEnvironment);
        repeater->OnEnvironmentsTearDownEnd(*parent_);
      }
    }

    elapsed_time_ = timer.Elapsed();

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG_GET(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);
  // Destroy environments in normal code, not in static teardown.
  bool delete_environment_on_teardown = true;
  if (delete_environment_on_teardown) {
    ForEach(environments_, internal::Delete<Environment>);
    environments_.clear();
  }

  // Try to warn the user if no tests matched the test filter.
  if (ShouldWarnIfNoTestsMatchFilter()) {
    const std::string filter_warning =
        std::string("filter \"") + GTEST_FLAG_GET(filter) +
        "\" did not match any test; no tests were run\n";
    ColoredPrintf(GTestColor::kRed, "WARNING: %s", filter_warning.c_str());
#if GTEST_HAS_FILE_SYSTEM
    AppendToTestWarningsOutputFile(filter_warning);
#endif  // GTEST_HAS_FILE_SYSTEM
  }

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        GTestColor::kRed,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
  }

  return !failed;
}